

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

char * my_stristr(char *string,char *pattern)

{
  __int32_t *p_Var1;
  __int32_t **pp_Var2;
  ulong uVar3;
  byte *pbVar4;
  byte bVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  do {
    bVar5 = *string;
    if (bVar5 == 0) {
      return (char *)0x0;
    }
    pp_Var2 = __ctype_toupper_loc();
    p_Var1 = *pp_Var2;
    uVar3 = (ulong)(byte)*pattern;
    pbVar7 = (byte *)string;
    while( true ) {
      string = (char *)(pbVar7 + 1);
      if (bVar5 == 0) {
        return (char *)0x0;
      }
      pbVar4 = pbVar7;
      pbVar6 = (byte *)(pattern + 1);
      if (p_Var1[bVar5] == p_Var1[uVar3]) break;
      bVar5 = *string;
      pbVar7 = (byte *)string;
    }
    while (p_Var1[*pbVar4] == p_Var1[uVar3]) {
      bVar5 = *pbVar6;
      uVar3 = (ulong)bVar5;
      pbVar4 = pbVar4 + 1;
      pbVar6 = pbVar6 + 1;
      if (bVar5 == 0) {
        return (char *)pbVar7;
      }
    }
  } while( true );
}

Assistant:

char *my_stristr(const char *string, const char *pattern)
{
	const char *pptr, *sptr;
	char *start;

	for (start = (char *)string; *start != 0; start++) {
		/* Find start of pattern in string */
		for ( ; ((*start != 0) && (toupper((unsigned char)*start) != toupper((unsigned char)*pattern))); start++)
			;
		if (*start == 0)
			return NULL;

		pptr = (const char *)pattern;
		sptr = (const char *)start;

		while (toupper((unsigned char)*sptr) == toupper((unsigned char)*pptr)) {
			sptr++;
			pptr++;

			/* If end of pattern then pattern was found */
			if (*pptr == 0)
				return (start);
		}
	}

	return NULL;
}